

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::WriteCustomCommandBuild
          (cmGlobalNinjaGenerator *this,string *command,string *description,string *comment,
          string *depfile,string *job_pool,bool uses_terminal,bool restat,string *config,
          CCOutputs *outputs,cmNinjaDeps *explicitDeps,cmNinjaDeps *orderOnlyDeps)

{
  cmNinjaVars *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  _func_int **pp_Var2;
  string *psVar3;
  string *psVar4;
  int iVar5;
  mapped_type *pmVar6;
  ostream *os;
  undefined4 extraout_var_00;
  string *dep;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  cmNinjaBuild build;
  allocator<char> local_1c9;
  string local_1c8;
  key_type local_1a8;
  string *local_188;
  string *local_180;
  string *local_178;
  string local_170;
  cmNinjaBuild local_150;
  undefined4 extraout_var;
  
  local_188 = job_pool;
  local_180 = depfile;
  local_178 = description;
  AddCustomCommandRule(this);
  if (this->ComputingUnknownDependencies == true) {
    pbVar1 = (explicitDeps->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__v = (explicitDeps->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __v != pbVar1; __v = __v + 1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->CombinedCustomCommandExplicitDependencies,__v);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"CUSTOM_COMMAND",(allocator<char> *)&local_1c8);
  cmNinjaBuild::cmNinjaBuild(&local_150,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::_M_assign((string *)&local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&local_150.Outputs,&outputs->ExplicitOuts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&local_150.WorkDirOuts,&outputs->WorkDirOuts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&local_150.ExplicitDeps,explicitDeps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&local_150.OrderOnlyDeps,orderOnlyDeps);
  std::__cxx11::string::string((string *)&local_1c8,(string *)command);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"COMMAND",&local_1c9);
  this_00 = &local_150.Variables;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  EncodeLiteral(&local_1c8,this,local_178);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"DESC",&local_1c9);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_1a8);
  std::__cxx11::string::operator=((string *)pmVar6,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  psVar4 = local_180;
  psVar3 = local_188;
  if (restat) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"restat",(allocator<char> *)&local_1a8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_1c8);
    std::__cxx11::string::assign((char *)pmVar6);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  if (uses_terminal) {
    iVar5 = (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
              [0x40])(this);
    if ((char)iVar5 == '\0') goto LAB_002799a4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"pool",(allocator<char> *)&local_1a8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_1c8);
    std::__cxx11::string::assign((char *)pmVar6);
  }
  else {
LAB_002799a4:
    if (psVar3->_M_string_length == 0) goto LAB_002799e3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"pool",(allocator<char> *)&local_1a8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_1c8);
    std::__cxx11::string::_M_assign((string *)pmVar6);
  }
  std::__cxx11::string::~string((string *)&local_1c8);
LAB_002799e3:
  if (psVar4->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"depfile",(allocator<char> *)&local_1a8);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_1c8);
    std::__cxx11::string::_M_assign((string *)pmVar6);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  pp_Var2 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator;
  if (config->_M_string_length == 0) {
    iVar5 = (*pp_Var2[0x44])(this);
    os = (ostream *)CONCAT44(extraout_var_00,iVar5);
  }
  else {
    iVar5 = (*pp_Var2[0x41])(this);
    os = (ostream *)CONCAT44(extraout_var,iVar5);
  }
  WriteBuild(this,os,&local_150,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild(&local_150);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteCustomCommandBuild(
  std::string const& command, std::string const& description,
  std::string const& comment, std::string const& depfile,
  std::string const& job_pool, bool uses_terminal, bool restat,
  std::string const& config, CCOutputs outputs, cmNinjaDeps explicitDeps,
  cmNinjaDeps orderOnlyDeps)
{
  this->AddCustomCommandRule();

  if (this->ComputingUnknownDependencies) {
    // we need to track every dependency that comes in, since we are trying
    // to find dependencies that are side effects of build commands
    for (std::string const& dep : explicitDeps) {
      this->CombinedCustomCommandExplicitDependencies.insert(dep);
    }
  }

  {
    cmNinjaBuild build("CUSTOM_COMMAND");
    build.Comment = comment;
    build.Outputs = std::move(outputs.ExplicitOuts);
    build.WorkDirOuts = std::move(outputs.WorkDirOuts);
    build.ExplicitDeps = std::move(explicitDeps);
    build.OrderOnlyDeps = std::move(orderOnlyDeps);

    cmNinjaVars& vars = build.Variables;
    {
      std::string cmd = command; // NOLINT(*)
#ifdef _WIN32
      if (cmd.empty())
        // TODO Shouldn't an empty command be handled by ninja?
        cmd = "cmd.exe /c";
#endif
      vars["COMMAND"] = std::move(cmd);
    }
    vars["DESC"] = this->EncodeLiteral(description);
    if (restat) {
      vars["restat"] = "1";
    }
    if (uses_terminal && this->SupportsDirectConsole()) {
      vars["pool"] = "console";
    } else if (!job_pool.empty()) {
      vars["pool"] = job_pool;
    }
    if (!depfile.empty()) {
      vars["depfile"] = depfile;
    }
    if (config.empty()) {
      this->WriteBuild(*this->GetCommonFileStream(), build);
    } else {
      this->WriteBuild(*this->GetImplFileStream(config), build);
    }
  }
}